

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void HighsHashHelpers::sparse_combine32(u32 *hash,HighsInt index,u64 value)

{
  uint uVar1;
  u32 uVar2;
  ulong uVar3;
  u32 uVar4;
  ulong uVar5;
  
  uVar1 = *hash;
  uVar2 = modexp_M31(*(uint *)(&DAT_003ab840 + (ulong)(index & 0x3f) * 8) & 0x7fffffff,
                     ((ulong)(long)index >> 6) + 1);
  uVar3 = (ulong)uVar2 *
          (((value >> 0x20) + 0x80c8963be3e4c2f3) * ((value & 0xffffffff) + 0xc8497d2a400d9551) >>
           0x21 | 1);
  uVar3 = (uVar3 >> 0x1f) * -0x7fffffff + uVar3;
  uVar5 = (ulong)((int)uVar3 + 0x80000001);
  if (uVar3 < 0x7fffffff) {
    uVar5 = uVar3;
  }
  uVar5 = (uVar5 & 0xffffffff) + (ulong)uVar1;
  uVar5 = (uVar5 & 0x7fffffff) + (uVar5 >> 0x1f);
  uVar4 = (u32)uVar5;
  uVar2 = uVar4 + 0x80000001;
  if (uVar5 < 0x7fffffff) {
    uVar2 = uVar4;
  }
  *hash = uVar2;
  return;
}

Assistant:

static void sparse_combine32(u32& hash, HighsInt index, u64 value) {
    // we take each value of the sparse hash as coefficient for a polynomial
    // of the finite field modulo the mersenne prime 2^61-1 where the monomial
    // for a sparse entry has the degree of its index. We evaluate the
    // polynomial at a random constant. This allows to compute the hashes of
    // sparse vectors independently of each others nonzero contribution and
    // therefore allows to use the order of best access patterns for cache
    // performance. E.g. we can compute a strong hash value for parallel row and
    // column detection and only need to loop over the nonzeros once in
    // arbitrary order. This comes at the expense of more expensive hash
    // calculations as it would be more efficient to evaluate the polynomial
    // with horners scheme, but allows for parallelization and arbitrary order.
    // Since we have 16 random constants available, we slightly improve
    // the scheme by using a lower degree polynomial with 16 variables
    // which we evaluate at the random vector of 16.

    // make sure input value is never zero and at most 31bits are used
    value = (pair_hash<0>(static_cast<u32>(value), value >> 32) >> 33) | 1;

    // make sure that the constant has at most 31 bits, as otherwise the modulo
    // algorithm for multiplication mod M31 might not work properly due to
    // overflow
    u32 a = static_cast<u32>(c[index & 63] & M31());
    u64 degree = (static_cast<u64>(index) >> 6) + 1;

    u64 result = hash;
    result += multiply_modM31(static_cast<u32>(value), modexp_M31(a, degree));
    result = (result >> 31) + (result & M31());
    if (result >= M31()) result -= M31();
    assert(result < M31());
    hash = static_cast<u32>(result);
  }